

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrate_baseline.cpp
# Opt level: O0

void parse_arg(int argc,char **argv,double *h,int *cpus)

{
  char *pcVar1;
  int iVar2;
  runtime_error *prVar3;
  double dVar4;
  allocator local_81;
  string local_80 [39];
  allocator local_59;
  string local_58 [48];
  int *local_28;
  int *cpus_local;
  double *h_local;
  char **argv_local;
  int argc_local;
  
  local_28 = cpus;
  cpus_local = (int *)h;
  h_local = (double *)argv;
  argv_local._4_4_ = argc;
  if (argc < 3) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Incorrect input");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar1 = argv[1];
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,pcVar1,&local_59);
  dVar4 = std::__cxx11::stod((string *)local_58,(size_t *)0x0);
  *(double *)cpus_local = dVar4;
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  pcVar1 = (char *)h_local[2];
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,pcVar1,&local_81);
  iVar2 = std::__cxx11::stoi((string *)local_80,(size_t *)0x0,10);
  *local_28 = iVar2;
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  if (*local_28 < 1) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Cant ran in less than 1 thread");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void parse_arg(int argc, char *argv[], double &h, int &cpus){
  if(argc  < 3)
    throw std::runtime_error("Incorrect input");
  try{
    h = std::stod(argv[1]);
    cpus = std::stoi(argv[2]);
  }catch(...){
    throw std::runtime_error("Parsing failed");
  }
  if (cpus < 1){
    throw std::runtime_error("Cant ran in less than 1 thread");
  }
}